

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::alloc
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,int new_len)

{
  vector3_base<int> *p;
  uint uVar1;
  int iVar2;
  vector3_base<int> *pvVar3;
  long lVar4;
  
  this->list_size = new_len;
  pvVar3 = allocator_default<vector3_base<int>_>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  lVar4 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; p = this->list, (ulong)uVar1 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    *(undefined4 *)((long)&pvVar3->field_2 + lVar4) = *(undefined4 *)((long)&p->field_2 + lVar4);
    *(undefined8 *)((long)&pvVar3->field_0 + lVar4) = *(undefined8 *)((long)&p->field_0 + lVar4);
  }
  allocator_default<vector3_base<int>_>::free_array(p);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pvVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}